

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

int __thiscall ON_wString::Find(ON_wString *this,wchar_t *wcharString,size_t start_index)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  bool bVar3;
  int iVar4;
  int element_count1;
  int iVar5;
  wchar_t *local_48;
  wchar_t *p;
  wchar_t *p1;
  wchar_t w0;
  int this_length;
  int length;
  int start_index_as_int;
  size_t start_index_local;
  wchar_t *wcharString_local;
  ON_wString *this_local;
  
  if (start_index < 0x7fffffff) {
    iVar4 = (int)start_index;
    element_count1 = Length(wcharString);
    if (((0 < element_count1) && (iVar5 = Length(this), iVar4 < iVar5)) &&
       (element_count1 <= iVar5 - iVar4)) {
      wVar1 = *wcharString;
      pwVar2 = this->m_s;
      for (local_48 = this->m_s + iVar4; local_48 <= pwVar2 + (iVar5 - element_count1);
          local_48 = local_48 + 1) {
        if ((wVar1 == *local_48) &&
           (bVar3 = EqualOrdinal(local_48,element_count1,wcharString,element_count1,false), bVar3))
        {
          return (int)((long)local_48 - (long)this->m_s >> 2);
        }
      }
    }
  }
  return -1;
}

Assistant:

int ON_wString::Find(
  const wchar_t* wcharString,
  size_t start_index
  ) const
{
  if ( start_index < 0x7FFFFFFF )
  {
    const int start_index_as_int = (int)start_index;
    const int length = ON_wString::Length(wcharString);
    if (length > 0)
    {
      const int this_length = Length();
      if ( start_index_as_int < this_length && (this_length - start_index_as_int) >= length )
      {
        const wchar_t w0 = wcharString[0];
        const wchar_t* p1 = m_s + (this_length - length);
        for (const wchar_t* p = m_s + start_index_as_int; p <= p1; p++)
        {
          if (w0 == p[0] && ON_wString::EqualOrdinal(p, length, wcharString, length, false) )
            return ((int)(p - m_s));
        }
      }
    }
  }
  return -1;
}